

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void send_all_trees(deflate_state *s,int lcodes,int dcodes,int blcodes)

{
  ushort uVar1;
  uint uVar2;
  int val_3;
  int len_3;
  int val_2;
  int len_2;
  int val_1;
  int len_1;
  int val;
  int len;
  int rank;
  int blcodes_local;
  int dcodes_local;
  int lcodes_local;
  deflate_state *s_local;
  
  if (s->bi_valid < 0xc) {
    s->bi_buf = s->bi_buf | (ushort)(lcodes + -0x101 << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 5;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)(lcodes - 0x101U << ((byte)s->bi_valid & 0x1f));
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)s->bi_buf;
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)((int)(lcodes - 0x101U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -0xb;
  }
  if (s->bi_valid < 0xc) {
    s->bi_buf = s->bi_buf | (ushort)(dcodes + -1 << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 5;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)(dcodes - 1U << ((byte)s->bi_valid & 0x1f));
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)s->bi_buf;
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)((int)(dcodes - 1U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -0xb;
  }
  if (s->bi_valid < 0xd) {
    s->bi_buf = s->bi_buf | (ushort)(blcodes + -4 << ((byte)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + 4;
  }
  else {
    s->bi_buf = s->bi_buf | (ushort)(blcodes - 4U << ((byte)s->bi_valid & 0x1f));
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)s->bi_buf;
    uVar2 = s->pending;
    s->pending = uVar2 + 1;
    s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)((int)(blcodes - 4U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + -0xc;
  }
  for (val = 0; val < blcodes; val = val + 1) {
    if (s->bi_valid < 0xe) {
      s->bi_buf = s->bi_buf | s->bl_tree["\x10\x11\x12"[val]].dl.dad << ((byte)s->bi_valid & 0x1f);
      s->bi_valid = s->bi_valid + 3;
    }
    else {
      uVar1 = s->bl_tree["\x10\x11\x12"[val]].dl.dad;
      s->bi_buf = s->bi_buf | uVar1 << ((byte)s->bi_valid & 0x1f);
      uVar2 = s->pending;
      s->pending = uVar2 + 1;
      s->pending_buf[uVar2] = (Bytef)s->bi_buf;
      uVar2 = s->pending;
      s->pending = uVar2 + 1;
      s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
      s->bi_buf = (ush)((int)(uint)uVar1 >> (0x10U - (char)s->bi_valid & 0x1f));
      s->bi_valid = s->bi_valid + -0xd;
    }
  }
  send_tree(s,s->dyn_ltree,lcodes + -1);
  send_tree(s,s->dyn_dtree,dcodes + -1);
  return;
}

Assistant:

local void send_all_trees(s, lcodes, dcodes, blcodes)
    deflate_state *s;
    int lcodes, dcodes, blcodes; /* number of codes for each tree */
{
    int rank;                    /* index in bl_order */

    Assert (lcodes >= 257 && dcodes >= 1 && blcodes >= 4, "not enough codes");
    Assert (lcodes <= L_CODES && dcodes <= D_CODES && blcodes <= BL_CODES,
            "too many codes");
    Tracev((stderr, "\nbl counts: "));
    send_bits(s, lcodes-257, 5); /* not +255 as stated in appnote.txt */
    send_bits(s, dcodes-1,   5);
    send_bits(s, blcodes-4,  4); /* not -3 as stated in appnote.txt */
    for (rank = 0; rank < blcodes; rank++) {
        Tracev((stderr, "\nbl code %2d ", bl_order[rank]));
        send_bits(s, s->bl_tree[bl_order[rank]].Len, 3);
    }
    Tracev((stderr, "\nbl tree: sent %ld", s->bits_sent));

    send_tree(s, (ct_data *)s->dyn_ltree, lcodes-1); /* literal tree */
    Tracev((stderr, "\nlit tree: sent %ld", s->bits_sent));

    send_tree(s, (ct_data *)s->dyn_dtree, dcodes-1); /* distance tree */
    Tracev((stderr, "\ndist tree: sent %ld", s->bits_sent));
}